

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_from_quat(mat4 *__return_storage_ptr__,quat q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = q.x;
  fVar2 = q.y;
  fVar3 = q.z;
  fVar5 = fVar2 + fVar2;
  fVar4 = q.w + q.w;
  fVar7 = fVar1 * 2.0;
  fVar8 = fVar3 * -2.0 * fVar3;
  fVar6 = 1.0 - fVar7 * fVar1;
  *(ulong *)__return_storage_ptr__->m =
       CONCAT44(-(fVar3 * fVar4) + fVar7 * fVar2,(1.0 - fVar5 * fVar2) + fVar8);
  __return_storage_ptr__->m[2] = fVar3 * fVar7 + fVar2 * fVar4;
  __return_storage_ptr__->m[3] = 0.0;
  *(ulong *)(__return_storage_ptr__->m + 4) = CONCAT44(fVar8 + fVar6,fVar7 * fVar2 + fVar3 * fVar4);
  __return_storage_ptr__->m[6] = fVar5 * fVar3 - fVar4 * fVar1;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[8] = fVar3 * fVar7 - fVar2 * fVar4;
  *(ulong *)(__return_storage_ptr__->m + 9) =
       CONCAT44(-fVar5 * fVar2 + fVar6,fVar5 * fVar3 + fVar4 * fVar1);
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_from_quat(quat q) {
    float x = q.x;
    float y = q.y;
    float z = q.z;
    float w = q.w;

    return mat4_create(
            1.0f - 2.0f * y * y - 2.0f * z * z, 2.0f * x * y - 2.0f * w * z, 2.0f * x * z + 2.0f * w * y,
            0.0f,
            2.0f * x * y + 2.0f * w * z, 1.0f - 2.0f * x * x - 2.0f * z * z, 2.0f * y * z - 2.0f * w * x,
            0.0f,
            2.0f * x * z - 2.0f * w * y, 2.0f * y * z + 2.0f * w * x, 1.0f - 2.0f * x * x - 2.0f * y * y,
            0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}